

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pager_write_pagelist(Pager *pPager,PgHdr *pList)

{
  Pgno iPage;
  sqlite3_io_methods *psVar1;
  long lVar2;
  void *pvVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  sqlite3_int64 szFile;
  
  if (pPager->fd->pMethods == (sqlite3_io_methods *)0x0) {
    iVar6 = (*pPager->pVfs->xOpen)
                      (pPager->pVfs,(char *)0x0,pPager->fd,pPager->vfsFlags & 0x1087f61 | 0x1e,
                       (int *)0x0);
    if (iVar6 != 0) goto LAB_0012821d;
  }
  uVar5 = pPager->dbSize;
  iVar6 = 0;
  if ((pPager->dbHintSize < uVar5) &&
     ((pList->pDirty != (PgHdr *)0x0 || (pPager->dbHintSize < pList->pgno)))) {
    szFile = pPager->pageSize * (ulong)uVar5;
    psVar1 = pPager->fd->pMethods;
    if (psVar1 != (sqlite3_io_methods *)0x0) {
      (*psVar1->xFileControl)(pPager->fd,5,&szFile);
      uVar5 = pPager->dbSize;
    }
    pPager->dbHintSize = uVar5;
  }
LAB_0012821d:
  for (; (iVar6 == 0 && (pList != (PgHdr *)0x0)); pList = pList->pDirty) {
    iPage = pList->pgno;
    iVar6 = 0;
    if ((iPage <= pPager->dbSize) && ((pList->flags & 0x10) == 0)) {
      lVar2 = pPager->pageSize;
      lVar7 = lVar2;
      if (iPage == 1) {
        pager_write_changecounter(pList);
        lVar7 = pPager->pageSize;
      }
      pvVar3 = pList->pData;
      iVar6 = (*pPager->fd->pMethods->xWrite)
                        (pPager->fd,pvVar3,(int)lVar7,lVar2 * (ulong)(iPage - 1));
      if (iPage == 1) {
        uVar4 = *(undefined8 *)((long)pvVar3 + 0x20);
        *(undefined8 *)pPager->dbFileVers = *(undefined8 *)((long)pvVar3 + 0x18);
        *(undefined8 *)(pPager->dbFileVers + 8) = uVar4;
      }
      if (pPager->dbFileSize < iPage) {
        pPager->dbFileSize = iPage;
      }
      pPager->aStat[2] = pPager->aStat[2] + 1;
      sqlite3BackupUpdate(pPager->pBackup,iPage,(u8 *)pList->pData);
    }
  }
  return iVar6;
}

Assistant:

static int pager_write_pagelist(Pager *pPager, PgHdr *pList){
  int rc = SQLITE_OK;                  /* Return code */

  /* This function is only called for rollback pagers in WRITER_DBMOD state. */
  assert( !pagerUseWal(pPager) );
  assert( pPager->tempFile || pPager->eState==PAGER_WRITER_DBMOD );
  assert( pPager->eLock==EXCLUSIVE_LOCK );
  assert( isOpen(pPager->fd) || pList->pDirty==0 );

  /* If the file is a temp-file has not yet been opened, open it now. It
  ** is not possible for rc to be other than SQLITE_OK if this branch
  ** is taken, as pager_wait_on_lock() is a no-op for temp-files.
  */
  if( !isOpen(pPager->fd) ){
    assert( pPager->tempFile && rc==SQLITE_OK );
    rc = pagerOpentemp(pPager, pPager->fd, pPager->vfsFlags);
  }

  /* Before the first write, give the VFS a hint of what the final
  ** file size will be.
  */
  assert( rc!=SQLITE_OK || isOpen(pPager->fd) );
  if( rc==SQLITE_OK
   && pPager->dbHintSize<pPager->dbSize
   && (pList->pDirty || pList->pgno>pPager->dbHintSize)
  ){
    sqlite3_int64 szFile = pPager->pageSize * (sqlite3_int64)pPager->dbSize;
    sqlite3OsFileControlHint(pPager->fd, SQLITE_FCNTL_SIZE_HINT, &szFile);
    pPager->dbHintSize = pPager->dbSize;
  }

  while( rc==SQLITE_OK && pList ){
    Pgno pgno = pList->pgno;

    /* If there are dirty pages in the page cache with page numbers greater
    ** than Pager.dbSize, this means sqlite3PagerTruncateImage() was called to
    ** make the file smaller (presumably by auto-vacuum code). Do not write
    ** any such pages to the file.
    **
    ** Also, do not write out any page that has the PGHDR_DONT_WRITE flag
    ** set (set by sqlite3PagerDontWrite()).
    */
    if( pgno<=pPager->dbSize && 0==(pList->flags&PGHDR_DONT_WRITE) ){
      i64 offset = (pgno-1)*(i64)pPager->pageSize;   /* Offset to write */
      char *pData;                                   /* Data to write */

      assert( (pList->flags&PGHDR_NEED_SYNC)==0 );
      if( pList->pgno==1 ) pager_write_changecounter(pList);

      pData = pList->pData;

      /* Write out the page data. */
      rc = sqlite3OsWrite(pPager->fd, pData, pPager->pageSize, offset);

      /* If page 1 was just written, update Pager.dbFileVers to match
      ** the value now stored in the database file. If writing this
      ** page caused the database file to grow, update dbFileSize.
      */
      if( pgno==1 ){
        memcpy(&pPager->dbFileVers, &pData[24], sizeof(pPager->dbFileVers));
      }
      if( pgno>pPager->dbFileSize ){
        pPager->dbFileSize = pgno;
      }
      pPager->aStat[PAGER_STAT_WRITE]++;

      /* Update any backup objects copying the contents of this pager. */
      sqlite3BackupUpdate(pPager->pBackup, pgno, (u8*)pList->pData);

      PAGERTRACE(("STORE %d page %d hash(%08x)\n",
                   PAGERID(pPager), pgno, pager_pagehash(pList)));
      IOTRACE(("PGOUT %p %d\n", pPager, pgno));
      PAGER_INCR(sqlite3_pager_writedb_count);
    }else{
      PAGERTRACE(("NOSTORE %d page %d\n", PAGERID(pPager), pgno));
    }
    pager_set_pagehash(pList);
    pList = pList->pDirty;
  }

  return rc;
}